

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O3

char * ssh_close_warn_text(Backend *be)

{
  uint uVar1;
  char *pcVar2;
  
  if ((ssh_sharing_state *)be[4].interactor != (ssh_sharing_state *)0x0) {
    uVar1 = share_ndownstreams((ssh_sharing_state *)be[4].interactor);
    if (uVar1 != 0) {
      pcVar2 = "s";
      if (uVar1 == 1) {
        pcVar2 = anon_var_dwarf_3405d + 10;
      }
      pcVar2 = dupprintf("This will also close %d downstream connection%s.",(ulong)uVar1,pcVar2);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

static char *ssh_close_warn_text(Backend *be)
{
    Ssh *ssh = container_of(be, Ssh, backend);
    if (!ssh->connshare)
        return NULL;
    int ndowns = share_ndownstreams(ssh->connshare);
    if (ndowns == 0)
        return NULL;
    char *msg = dupprintf("This will also close %d downstream connection%s.",
                          ndowns, ndowns==1 ? "" : "s");
    return msg;
}